

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QDockWidgetGroupLayout::~QDockWidgetGroupLayout(QDockWidgetGroupLayout *this)

{
  QDockAreaLayoutInfo *in_RDI;
  QLayout *unaff_retaddr;
  
  in_RDI->sep = (int *)&PTR_metaObject_00d163e0;
  (in_RDI->separatorWidgets).d.ptr = (QWidget **)&PTR__QDockWidgetGroupLayout_00d164e8;
  QDockAreaLayoutInfo::deleteAllLayoutItems((QDockAreaLayoutInfo *)this);
  QDockAreaLayoutInfo::~QDockAreaLayoutInfo(in_RDI);
  QDockAreaLayoutInfo::~QDockAreaLayoutInfo(in_RDI);
  QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>::~QMainWindowLayoutSeparatorHelper
            ((QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *)in_RDI);
  QLayout::~QLayout(unaff_retaddr);
  return;
}

Assistant:

~QDockWidgetGroupLayout() {
        layoutState.deleteAllLayoutItems();
    }